

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O1

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  iterator __position;
  long *plVar1;
  vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>> *this_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  Pair *p;
  Pair *local_38;
  
  local_38 = (Pair *)operator_new(0x18);
  local_38->Method = (WatchMethod)0x0;
  local_38->ClientData = (void *)0x0;
  local_38->DeleteDataCall = (DeleteData)0x0;
  local_38->Method = method;
  local_38->ClientData = client_data;
  local_38->DeleteDataCall = delete_data;
  this_00 = (vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
            ::operator[](&this->WatchMap,variable);
  __position._M_current = *(Pair ***)(this_00 + 8);
  lVar2 = (long)__position._M_current - *(long *)this_00;
  bVar5 = lVar2 == 0;
  if (!bVar5) {
    uVar3 = lVar2 >> 3;
    uVar4 = 1;
    do {
      if (((client_data != (void *)0x0) &&
          (plVar1 = *(long **)(*(long *)this_00 + -8 + uVar4 * 8), (WatchMethod)*plVar1 == method))
         && ((void *)plVar1[1] == client_data)) {
        return bVar5;
      }
      bVar5 = uVar3 <= uVar4;
      lVar2 = (-(ulong)(uVar3 == 0) - uVar3) + uVar4;
      uVar4 = uVar4 + 1;
    } while (lVar2 != 0);
  }
  if (__position._M_current == *(Pair ***)(this_00 + 0x10)) {
    std::vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>>::
    _M_realloc_insert<cmVariableWatch::Pair*const&>(this_00,__position,&local_38);
  }
  else {
    *__position._M_current = local_38;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  return bVar5;
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable,
                               WatchMethod method, void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  cmVariableWatch::Pair* p = new cmVariableWatch::Pair;
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::size_type cc;
  for ( cc = 0; cc < vp->size(); cc ++ )
    {
    cmVariableWatch::Pair* pair = (*vp)[cc];
    if ( pair->Method == method &&
         client_data && client_data == pair->ClientData)
      {
      // Callback already exists
      return false;
      }
    }
  vp->push_back(p);
  return true;
}